

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O1

void duckdb::WriteCSVChunkInternal
               (ClientContext *context,FunctionData *bind_data,DataChunk *cast_chunk,
               MemoryStream *writer,DataChunk *input,bool *written_anything,
               ExpressionExecutor *executor)

{
  char cVar1;
  uint uVar2;
  unsigned_long *puVar3;
  pointer pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this;
  reference pvVar5;
  reference pvVar6;
  data_ptr_t pdVar7;
  long lVar8;
  size_type __n;
  reference rVar9;
  char local_69;
  WriteCSVData *local_68;
  DataChunk *local_60;
  _func_int **local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_50;
  ulong local_48;
  ulong local_40;
  vector<bool,_true> *local_38;
  
  local_68 = (WriteCSVData *)context;
  local_60 = input;
  DataChunk::Reset((DataChunk *)bind_data);
  bind_data[3]._vptr_FunctionData = (_func_int **)writer->position;
  ExpressionExecutor::Execute
            ((ExpressionExecutor *)written_anything,(DataChunk *)writer,(DataChunk *)bind_data);
  DataChunk::Flatten((DataChunk *)bind_data);
  if (bind_data[3]._vptr_FunctionData != (_func_int **)0x0) {
    local_50 = &(local_68->super_BaseCSVData).options.null_str;
    local_38 = &(local_68->super_BaseCSVData).options.force_quote;
    local_58 = (_func_int **)0x0;
    do {
      if ((local_58 == (_func_int **)0x0) &&
         (*(char *)&(local_60->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start == '\0')) {
        *(undefined1 *)
         &(local_60->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start = 1;
      }
      else {
        (**(code **)(cast_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                    .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start)
                  (cast_chunk,(local_68->newline)._M_dataplus._M_p,
                   (local_68->newline)._M_string_length);
      }
      if (bind_data[1]._vptr_FunctionData != bind_data->_vptr_FunctionData) {
        local_48 = 1L << ((byte)local_58 & 0x3f);
        local_40 = (ulong)local_58 >> 6;
        lVar8 = (long)local_58 * 0x10;
        __n = 0;
        do {
          if ((__n != 0) &&
             (cVar1 = *(local_68->super_BaseCSVData).options.dialect_options.state_machine_options.
                       delimiter.value._M_dataplus._M_p, cVar1 != '\0')) {
            local_69 = cVar1;
            (**(code **)(cast_chunk->data).
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start)(cast_chunk,&local_69,1);
          }
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)bind_data,__n);
          this = local_50;
          puVar3 = (pvVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[local_40] & local_48) != 0)) {
            pvVar5 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)bind_data,__n);
            pdVar7 = pvVar5->data;
            uVar2 = *(uint *)(pdVar7 + lVar8);
            if ((ulong)uVar2 < 0xd) {
              pdVar7 = pdVar7 + lVar8 + 4;
            }
            else {
              pdVar7 = *(data_ptr_t *)(pdVar7 + lVar8 + 8);
            }
            rVar9 = vector<bool,_true>::get<true>(local_38,__n);
            WriteQuotedString((WriteStream *)cast_chunk,local_68,(char *)pdVar7,(ulong)uVar2,
                              (*rVar9._M_p & rVar9._M_mask) != 0);
          }
          else {
            pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](local_50,0);
            pcVar4 = (pvVar6->_M_dataplus)._M_p;
            pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](this,0);
            (**(code **)(cast_chunk->data).
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start)
                      (cast_chunk,pcVar4,pvVar6->_M_string_length);
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)bind_data[1]._vptr_FunctionData -
                                (long)bind_data->_vptr_FunctionData >> 3) * 0x4ec4ec4ec4ec4ec5));
      }
      local_58 = (_func_int **)((long)local_58 + 1);
    } while (local_58 < bind_data[3]._vptr_FunctionData);
  }
  return;
}

Assistant:

static void WriteCSVChunkInternal(ClientContext &context, FunctionData &bind_data, DataChunk &cast_chunk,
                                  MemoryStream &writer, DataChunk &input, bool &written_anything,
                                  ExpressionExecutor &executor) {
	auto &csv_data = bind_data.Cast<WriteCSVData>();
	auto &options = csv_data.options;

	// first cast the columns of the chunk to varchar
	cast_chunk.Reset();
	cast_chunk.SetCardinality(input);

	executor.Execute(input, cast_chunk);

	cast_chunk.Flatten();
	// now loop over the vectors and output the values
	for (idx_t row_idx = 0; row_idx < cast_chunk.size(); row_idx++) {
		if (row_idx == 0 && !written_anything) {
			written_anything = true;
		} else {
			writer.WriteData(const_data_ptr_cast(csv_data.newline.c_str()), csv_data.newline.size());
		}
		// write values
		D_ASSERT(options.null_str.size() == 1);
		for (idx_t col_idx = 0; col_idx < cast_chunk.ColumnCount(); col_idx++) {
			if (col_idx != 0) {
				WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.delimiter.GetValue()[0]);
			}
			if (FlatVector::IsNull(cast_chunk.data[col_idx], row_idx)) {
				// write null value
				writer.WriteData(const_data_ptr_cast(options.null_str[0].c_str()), options.null_str[0].size());
				continue;
			}

			// non-null value, fetch the string value from the cast chunk
			auto str_data = FlatVector::GetData<string_t>(cast_chunk.data[col_idx]);
			// FIXME: we could gain some performance here by checking for certain types if they ever require quotes
			// (e.g. integers only require quotes if the delimiter is a number, decimals only require quotes if the
			// delimiter is a number or "." character)
			WriteQuotedString(writer, csv_data, str_data[row_idx].GetData(), str_data[row_idx].GetSize(),
			                  csv_data.options.force_quote[col_idx]);
		}
	}
}